

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__at_eof(stbi__context *s)

{
  int iVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    iVar1 = (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x28));
    if (iVar1 == 0) {
      return 0;
    }
    if (*(int *)(in_RDI + 0x30) == 0) {
      return 1;
    }
  }
  return (uint)(*(ulong *)(in_RDI + 0xc0) <= *(ulong *)(in_RDI + 0xb8));
}

Assistant:

stbi_inline static int stbi__at_eof(stbi__context *s)
{
   if (s->io.read) {
      if (!(s->io.eof)(s->io_user_data)) return 0;
      // if feof() is true, check if buffer = end
      // special case: we've only got the special 0 character at the end
      if (s->read_from_callbacks == 0) return 1;
   }

   return s->img_buffer >= s->img_buffer_end;
}